

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O2

int establish_server_connection(atom_server as,int do_fallback)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char ping_char;
  int delay_value;
  sockaddr_in sock_addr;
  
  delay_value = 1;
  ping_char = '\0';
  iVar1 = as->tcp_fd;
  if (iVar1 == -2) {
    return 0;
  }
  if ((iVar1 != -1) && (sVar3 = write(iVar1,&ping_char,1), sVar3 == 1)) {
    return 1;
  }
  fwrite("Establish server connection, write failed, creating socket\n",0x3b,1,_stderr);
  iVar1 = socket(2,1,0);
  if (iVar1 < 0) {
LAB_00103952:
    fwrite("Failed to create socket for ATL atom server connection.  Not enough File Descriptors?\n"
           ,0x56,1,_stderr);
  }
  else {
    sock_addr.sin_family = 2;
    fwrite("Establish server connection, fill_host_addr\n",0x2c,1,_stderr);
    iVar2 = fill_hostaddr(&sock_addr.sin_addr,atom_server_host);
    if (iVar2 == 0) {
LAB_00103a7f:
      fprintf(_stderr,"Unknown Host \"%s\" specified as ATL atom server.\n",atom_server_host);
    }
    else {
      sock_addr.sin_port = 0x5d11;
      printf("Trying connection to atom server on %s ...  ",atom_server_host);
      iVar2 = connect(iVar1,(sockaddr *)&sock_addr,0x10);
      if (-1 < iVar2) {
LAB_00103a54:
        puts("succeeded");
        setsockopt(iVar1,6,1,&delay_value,4);
        as->tcp_fd = iVar1;
        return 1;
      }
      puts("failed");
      iVar1 = socket(2,1,0);
      if (iVar1 < 0) goto LAB_00103952;
      atom_server_host = "atomhost.cercs.gatech.edu";
      sock_addr.sin_family = 2;
      iVar2 = fill_hostaddr(&sock_addr.sin_addr,"atomhost.cercs.gatech.edu");
      if (iVar2 == 0) goto LAB_00103a7f;
      sock_addr.sin_port = 0x5d11;
      printf("Trying fallback connection to atom server on %s ...  ",atom_server_host);
      iVar2 = connect(iVar1,(sockaddr *)&sock_addr,0x10);
      if (-1 < iVar2) goto LAB_00103a54;
      fwrite("Failed to connect to primary or fallback atom servers.\n",0x37,1,_stderr);
    }
    as->tcp_fd = -2;
  }
  return 0;
}

Assistant:

static int
establish_server_connection(atom_server as, int do_fallback)
{
    SOCKET sock;
    int delay_value = 1;
    char ping_char = 0;

    if (atom_server_verbose == -1) {
	if (getenv("ATOM_SERVER_VERBOSE") == NULL) {
	    atom_server_verbose = 0;
	} else {
	    atom_server_verbose = 1;
	}
    }
    if (as->tcp_fd == -2) return 0;
    if ((as->tcp_fd == -1) || 
	(write(as->tcp_fd, &ping_char, 1) != 1)) {
	/* reestablish connection, name_str is the machine name */
	struct sockaddr_in sock_addr;

	fprintf(stderr, "Establish server connection, write failed, creating socket\n");
	if ((sock = socket(AF_INET, SOCK_STREAM, 0)) < 0) {
	    fprintf(stderr, "Failed to create socket for ATL atom server connection.  Not enough File Descriptors?\n");
	    return 0;
	}
	
	sock_addr.sin_family = AF_INET;
		
	fprintf(stderr, "Establish server connection, fill_host_addr\n");
	if (fill_hostaddr(&sock_addr.sin_addr, atom_server_host) == 0) {
	    fprintf(stderr, "Unknown Host \"%s\" specified as ATL atom server.\n",
		    atom_server_host);
	    as->tcp_fd = -2;
	    return 0;
	}
	sock_addr.sin_port = htons(TCP_PORT);

	if (atom_server_verbose) {
	    printf("Trying connection to atom server on %s ...  ",
		   atom_server_host);
	}
	if (connect(sock, (struct sockaddr *) &sock_addr,
		    sizeof sock_addr) < 0) {

	    if (atom_server_verbose) {
		printf("failed\n");
	    }
	    if (!do_fallback) return 0;

	    /* fallback */
	    if ((sock = socket(AF_INET, SOCK_STREAM, 0)) < 0) {
		fprintf(stderr, "Failed to create socket for ATL atom server connection.  Not enough File Descriptors?\n");
	       return 0;
	    }
	    atom_server_host = "atomhost.cercs.gatech.edu";
	    sock_addr.sin_family = AF_INET;
	    if (fill_hostaddr(&sock_addr.sin_addr, atom_server_host) == 0){
		fprintf(stderr, "Unknown Host \"%s\" specified as ATL atom server.\n",
			atom_server_host);
		as->tcp_fd = -2;
		return 0;
	    }
	    sock_addr.sin_port = htons(TCP_PORT);
	    if (atom_server_verbose) {
		printf("Trying fallback connection to atom server on %s ...  ",
		       atom_server_host);
	    }
	    if (connect(sock, (struct sockaddr *) &sock_addr,
			sizeof sock_addr) < 0) {
		fprintf(stderr, "Failed to connect to primary or fallback atom servers.\n");
		as->tcp_fd = -2;
	        return 0;
	    }
	}
	if (atom_server_verbose) {
	    printf("succeeded\n");
	}
	setsockopt(sock, IPPROTO_TCP, TCP_NODELAY, (char *) &delay_value,
		   sizeof(delay_value));
	as->tcp_fd = sock;
	/* 
	 * ignore SIGPIPE's  (these pop up when ports die.  we catch the 
	 * failed writes) 
	 */
#ifdef SIGPIPE
	signal(SIGPIPE, SIG_IGN);
#endif
    }
    return 1;
}